

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint32_t __thiscall AmpIO::GetAnalogInput(AmpIO *this,uint index)

{
  uint uVar1;
  
  uVar1 = 0;
  if (index < this->NumMotors) {
    uVar1 = (uint)*(ushort *)((long)this->ReadBuffer + (ulong)(index + 4) * 4 + 2);
  }
  return uVar1;
}

Assistant:

uint32_t AmpIO::GetAnalogInput(unsigned int index) const
{
    // Checking against NumMotors is correct because the analog input (e.g., pot) is in the same
    // quadlet as the motor current feedback. Logically, it would have made more sense to use
    // NumEncoders, since the number of pots would likely match the number of encoders.
    if (index >= NumMotors)
        return 0L;

    quadlet_t buff;
    buff = ReadBuffer[index+ANALOG_POS_OFFSET];
    buff &= ANALOG_POS_MASK;       // mask for applicable bits
    buff >>= 16;                   // shift to lsb alignment

    return static_cast<uint32_t>(buff) & ADC_MASK;
}